

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::local_time(sequence *__return_storage_ptr__,spec *s)

{
  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *this;
  long *plVar1;
  sequence local_108;
  repeat_at_least local_e8;
  maybe local_d0;
  maybe local_c0;
  repeat_exact local_b0;
  digit local_98;
  sequence local_80;
  character local_60;
  character local_50;
  digit local_40;
  
  local_80.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004cd7d0;
  local_80.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__scanner_base_004cc9a0;
  local_80.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_2_ = 0x3930;
  repeat_exact::repeat_exact<toml::detail::syntax::digit>
            ((repeat_exact *)&local_108,2,(digit *)&local_80);
  local_e8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cc8e0;
  local_e8.length_._0_1_ = 0x3a;
  local_98.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004cd7d0;
  local_98.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004cc9a0;
  local_98.scanner_.from_ = '0';
  local_98.scanner_.to_ = '9';
  repeat_exact::repeat_exact<toml::detail::syntax::digit>(&local_b0,2,&local_98);
  sequence::sequence<toml::detail::repeat_exact,toml::detail::character,toml::detail::repeat_exact>
            (__return_storage_ptr__,(repeat_exact *)&local_108,(character *)&local_e8,&local_b0);
  if ((long *)CONCAT62(local_b0.other_.scanner_._M_t.
                       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl.
                       _2_6_,local_b0.other_.scanner_._M_t.
                             super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                             .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>.
                             _M_head_impl._0_2_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT62(local_b0.other_.scanner_._M_t.
                                   super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                                   .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>.
                                   _M_head_impl._2_6_,
                                   local_b0.other_.scanner_._M_t.
                                   super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                                   .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>.
                                   _M_head_impl._0_2_) + 8))();
  }
  if (local_108.others_.
      super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)((local_108.others_.
                super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ._M_impl.super__Vector_impl_data._M_finish)->scanner_)._M_t.
              super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
              ._M_t.
              super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
              .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl[1].
              _vptr_scanner_base)();
  }
  if (s->v1_1_0_make_seconds_optional == true) {
    local_50.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cc8e0;
    local_50.value_ = ':';
    local_98.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004cd7d0;
    local_98.scanner_.super_scanner_base._vptr_scanner_base =
         (_func_int **)&PTR__scanner_base_004cc9a0;
    local_98.scanner_.from_ = '0';
    local_98.scanner_.to_ = '9';
    repeat_exact::repeat_exact<toml::detail::syntax::digit>(&local_b0,2,&local_98);
    local_60.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cc8e0;
    local_60.value_ = '.';
    local_40.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004cd7d0;
    local_40.scanner_.super_scanner_base._vptr_scanner_base =
         (_func_int **)&PTR__scanner_base_004cc9a0;
    local_40.scanner_.from_ = '0';
    local_40.scanner_.to_ = '9';
    repeat_at_least::repeat_at_least<toml::detail::syntax::digit>(&local_e8,1,&local_40);
    sequence::sequence<toml::detail::character,toml::detail::repeat_at_least>
              (&local_80,&local_60,&local_e8);
    maybe::maybe<toml::detail::sequence>(&local_d0,&local_80);
    sequence::sequence<toml::detail::character,toml::detail::repeat_exact,toml::detail::maybe>
              (&local_108,&local_50,&local_b0,&local_d0);
    maybe::maybe<toml::detail::sequence>(&local_c0,&local_108);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    emplace_back<toml::detail::maybe>(&__return_storage_ptr__->others_,&local_c0);
    if (local_c0.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
        (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
         )0x0) {
      (*(*(_func_int ***)
          local_c0.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
    }
    local_c0.other_.scanner_._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
         (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
         (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
          )0x0;
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&local_108.others_);
    if (local_d0.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
        (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
         )0x0) {
      (*(*(_func_int ***)
          local_d0.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
    }
    local_d0.other_.scanner_._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
         (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
         (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
          )0x0;
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&local_80.others_);
    if (local_e8.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
        (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
         )0x0) {
      (*(*(_func_int ***)
          local_e8.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
    }
    plVar1 = (long *)CONCAT62(local_b0.other_.scanner_._M_t.
                              super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                              .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>.
                              _M_head_impl._2_6_,
                              local_b0.other_.scanner_._M_t.
                              super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                              .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>.
                              _M_head_impl._0_2_);
  }
  else {
    local_108.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cc8e0;
    local_108.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x3a;
    this = &__return_storage_ptr__->others_;
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    emplace_back<toml::detail::character>(this,(character *)&local_108);
    local_80.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004cd7d0;
    local_80.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__scanner_base_004cc9a0;
    local_80.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0x3930;
    repeat_exact::repeat_exact<toml::detail::syntax::digit>
              ((repeat_exact *)&local_108,2,(digit *)&local_80);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    emplace_back<toml::detail::repeat_exact>(this,(repeat_exact *)&local_108);
    if (local_108.others_.
        super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      (**(code **)((long)((local_108.others_.
                           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->scanner_)._M_t.
                         super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                         .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> + 8))();
    }
    local_e8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cc8e0;
    local_e8.length_._0_1_ = 0x2e;
    local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004cd7d0;
    local_b0.length_ = (size_t)&PTR__scanner_base_004cc9a0;
    local_b0.other_.scanner_._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl._0_2_ = 0x3930;
    repeat_at_least::repeat_at_least<toml::detail::syntax::digit>
              ((repeat_at_least *)&local_80,1,(digit *)&local_b0);
    sequence::sequence<toml::detail::character,toml::detail::repeat_at_least>
              (&local_108,(character *)&local_e8,(repeat_at_least *)&local_80);
    maybe::maybe<toml::detail::sequence>((maybe *)&local_98,&local_108);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    emplace_back<toml::detail::maybe>(this,(maybe *)&local_98);
    if (local_98.scanner_.super_scanner_base._vptr_scanner_base != (_func_int **)0x0) {
      (**(code **)(*local_98.scanner_.super_scanner_base._vptr_scanner_base + 8))();
    }
    local_98.scanner_.super_scanner_base._vptr_scanner_base = (_func_int **)0x0;
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&local_108.others_);
    plVar1 = (long *)CONCAT62(local_80.others_.
                              super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                              ._M_impl.super__Vector_impl_data._M_finish._2_6_,
                              local_80.others_.
                              super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                              ._M_impl.super__Vector_impl_data._M_finish._0_2_);
  }
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence local_time(const spec& s)
{
    auto time = sequence(
            repeat_exact(2, digit(s)),
            character(':'),
            repeat_exact(2, digit(s))
        );

    if(s.v1_1_0_make_seconds_optional)
    {
        time.push_back(maybe(sequence(
                character(':'),
                repeat_exact(2, digit(s)),
                maybe(sequence(character('.'), repeat_at_least(1, digit(s))))
            )));
    }
    else
    {
        time.push_back(character(':'));
        time.push_back(repeat_exact(2, digit(s)));
        time.push_back(
            maybe(sequence(character('.'), repeat_at_least(1, digit(s))))
        );
    }

    return time;
}